

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_clone(archive_entry *entry)

{
  void *p_00;
  void *p;
  size_t s;
  ae_sparse *sp;
  ae_xattr *xp;
  archive_entry *entry2;
  archive_entry *entry_local;
  
  entry2 = entry;
  xp = (ae_xattr *)archive_entry_new2(entry->archive);
  if ((archive_entry *)xp == (archive_entry *)0x0) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    memcpy(&((archive_entry *)xp)->ae_stat,&entry2->ae_stat,0xa8);
    xp[9].value = (void *)entry2->ae_fflags_set;
    xp[9].size = entry2->ae_fflags_clear;
    archive_mstring_copy((archive_mstring *)&xp[6].name,&entry2->ae_fflags_text);
    archive_mstring_copy((archive_mstring *)(xp + 10),&entry2->ae_gname);
    archive_mstring_copy((archive_mstring *)&xp[0xd].name,&entry2->ae_linkname);
    archive_mstring_copy((archive_mstring *)&xp[0x10].value,&entry2->ae_pathname);
    archive_mstring_copy((archive_mstring *)(xp + 0x17),&entry2->ae_sourcepath);
    *(wchar_t *)&xp[6].next = entry2->ae_set;
    archive_mstring_copy((archive_mstring *)&xp[0x13].size,&entry2->ae_uname);
    *(wchar_t *)((long)&xp[0x24].value + 4) = entry2->ae_symlink_type;
    *(char *)&xp[0x1a].name = entry2->encryption;
    xp[0x1b].next = *(ae_xattr **)(entry2->digest).md5;
    xp[0x1b].name = *(char **)((entry2->digest).md5 + 8);
    xp[0x1b].value = *(void **)(entry2->digest).rmd160;
    xp[0x1b].size = *(size_t *)((entry2->digest).rmd160 + 8);
    *(undefined4 *)&xp[0x1c].next = *(undefined4 *)((entry2->digest).rmd160 + 0x10);
    *(undefined8 *)((long)&xp[0x1c].next + 4) = *(undefined8 *)(entry2->digest).sha1;
    *(undefined8 *)((long)&xp[0x1c].name + 4) = *(undefined8 *)((entry2->digest).sha1 + 8);
    *(undefined4 *)((long)&xp[0x1c].value + 4) = *(undefined4 *)((entry2->digest).sha1 + 0x10);
    xp[0x1c].size = *(size_t *)(entry2->digest).sha256;
    xp[0x1d].next = *(ae_xattr **)((entry2->digest).sha256 + 8);
    xp[0x1d].name = *(char **)((entry2->digest).sha256 + 0x10);
    xp[0x1d].value = *(void **)((entry2->digest).sha256 + 0x18);
    memcpy(&xp[0x1d].size,(entry2->digest).sha384,0x30);
    memcpy(&xp[0x1f].name,(entry2->digest).sha512,0x40);
    archive_acl_copy((archive_acl *)&xp[0x21].name,&entry2->acl);
    p_00 = archive_entry_mac_metadata(entry2,(size_t *)&p);
    archive_entry_copy_mac_metadata((archive_entry *)xp,p_00,(size_t)p);
    for (sp = (ae_sparse *)entry2->xattr_head; sp != (ae_sparse *)0x0; sp = sp->next) {
      archive_entry_xattr_add_entry
                ((archive_entry *)xp,(char *)sp->offset,(void *)sp->length,(size_t)sp[1].next);
    }
    for (s = (size_t)entry2->sparse_head; s != 0; s = *(size_t *)s) {
      archive_entry_sparse_add_entry
                ((archive_entry *)xp,*(la_int64_t *)(s + 8),*(la_int64_t *)(s + 0x10));
    }
    entry_local = (archive_entry *)xp;
  }
  return entry_local;
}

Assistant:

struct archive_entry *
archive_entry_clone(struct archive_entry *entry)
{
	struct archive_entry *entry2;
	struct ae_xattr *xp;
	struct ae_sparse *sp;
	size_t s;
	const void *p;

	/* Allocate new structure and copy over all of the fields. */
	/* TODO: Should we copy the archive over?  Or require a new archive
	 * as an argument? */
	entry2 = archive_entry_new2(entry->archive);
	if (entry2 == NULL)
		return (NULL);
	entry2->ae_stat = entry->ae_stat;
	entry2->ae_fflags_set = entry->ae_fflags_set;
	entry2->ae_fflags_clear = entry->ae_fflags_clear;

	/* TODO: XXX If clone can have a different archive, what do we do here if
	 * character sets are different? XXX */
	archive_mstring_copy(&entry2->ae_fflags_text, &entry->ae_fflags_text);
	archive_mstring_copy(&entry2->ae_gname, &entry->ae_gname);
	archive_mstring_copy(&entry2->ae_linkname, &entry->ae_linkname);
	archive_mstring_copy(&entry2->ae_pathname, &entry->ae_pathname);
	archive_mstring_copy(&entry2->ae_sourcepath, &entry->ae_sourcepath);
	entry2->ae_set = entry->ae_set;
	archive_mstring_copy(&entry2->ae_uname, &entry->ae_uname);

	/* Copy symlink type */
	entry2->ae_symlink_type = entry->ae_symlink_type;

	/* Copy encryption status */
	entry2->encryption = entry->encryption;

	/* Copy digests */
#define copy_digest(_e2, _e, _t) \
	memcpy(_e2->digest._t, _e->digest._t, sizeof(_e2->digest._t))

	copy_digest(entry2, entry, md5);
	copy_digest(entry2, entry, rmd160);
	copy_digest(entry2, entry, sha1);
	copy_digest(entry2, entry, sha256);
	copy_digest(entry2, entry, sha384);
	copy_digest(entry2, entry, sha512);

#undef copy_digest
	
	/* Copy ACL data over. */
	archive_acl_copy(&entry2->acl, &entry->acl);

	/* Copy Mac OS metadata. */
	p = archive_entry_mac_metadata(entry, &s);
	archive_entry_copy_mac_metadata(entry2, p, s);

	/* Copy xattr data over. */
	xp = entry->xattr_head;
	while (xp != NULL) {
		archive_entry_xattr_add_entry(entry2,
		    xp->name, xp->value, xp->size);
		xp = xp->next;
	}

	/* Copy sparse data over. */
	sp = entry->sparse_head;
	while (sp != NULL) {
		archive_entry_sparse_add_entry(entry2,
		    sp->offset, sp->length);
		sp = sp->next;
	}

	return (entry2);
}